

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void predicate_suite::test_all_of(void)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  view_pointer local_d0;
  size_type local_c8;
  view_pointer local_c0;
  size_type local_b8;
  view_pointer local_a8;
  size_type local_a0;
  view_pointer local_98;
  size_type local_90;
  view_pointer local_80;
  size_type local_78;
  view_pointer local_70;
  size_type local_68;
  view_pointer local_58;
  size_type local_50;
  view_pointer local_48;
  size_type local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0xb);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_48 = iVar2.parent;
  local_40 = iVar2.current;
  local_58 = iVar3.parent;
  local_50 = iVar3.current;
  bVar1 = std::
          all_of<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,predicate_suite::test_all_of()::__0>
                    (local_48,local_40,local_58,local_50);
  boost::detail::test_impl
            ("std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1a1,"void predicate_suite::test_all_of()",bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0xb);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_70 = iVar2.parent;
  local_68 = iVar2.current;
  local_80 = iVar3.parent;
  local_78 = iVar3.current;
  bVar1 = std::
          all_of<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,predicate_suite::test_all_of()::__1>
                    (local_70,local_68,local_80,local_78);
  boost::detail::test_impl
            ("std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1a3,"void predicate_suite::test_all_of()",bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_98 = iVar2.parent;
  local_90 = iVar2.current;
  local_a8 = iVar3.parent;
  local_a0 = iVar3.current;
  bVar1 = std::
          all_of<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,predicate_suite::test_all_of()::__2>
                    (local_98,local_90,local_a8,local_a0);
  boost::detail::test_impl
            ("!std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1a5,"void predicate_suite::test_all_of()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_c0 = iVar2.parent;
  local_b8 = iVar2.current;
  local_d0 = iVar3.parent;
  local_c8 = iVar3.current;
  bVar1 = std::
          all_of<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,predicate_suite::test_all_of()::__3>
                    (local_c0,local_b8,local_d0,local_c8);
  boost::detail::test_impl
            ("std::all_of(span.begin(), span.end(), [] (int current) { return current == 55; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1a9,"void predicate_suite::test_all_of()",(bool)(-bVar1 & 1));
  return;
}

Assistant:

void test_all_of()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.push_back(11);
    BOOST_TEST(std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(11);
    BOOST_TEST(std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(55);
    BOOST_TEST(!std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(55);
    span.push_back(55);
    span.push_back(55);
    BOOST_TEST(std::all_of(span.begin(), span.end(), [] (int current) { return current == 55; }));
}